

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O1

void __thiscall
cppjieba::HMMSegment::InternalCut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  pointer *ppWVar1;
  iterator __position;
  ulong uVar2;
  const_iterator pRVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> status;
  WordRange wr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  WordRange local_30;
  
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Viterbi(this,begin,end,&local_48);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
    pRVar3 = begin;
    do {
      if ((local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2] & 1) != 0) {
        __position._M_current =
             (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        local_30.left = begin;
        local_30.right = pRVar3;
        if (__position._M_current ==
            (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
          _M_realloc_insert<cppjieba::WordRange_const&>
                    ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,
                     __position,&local_30);
        }
        else {
          (__position._M_current)->left = begin;
          (__position._M_current)->right = pRVar3;
          ppWVar1 = &(res->
                     super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppWVar1 = *ppWVar1 + 1;
        }
        begin = pRVar3 + 1;
      }
      uVar2 = uVar2 + 1;
      pRVar3 = pRVar3 + 1;
    } while (uVar2 < (ulong)((long)local_48.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_48.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void InternalCut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res) const {
    vector<size_t> status;
    Viterbi(begin, end, status);

    RuneStrArray::const_iterator left = begin;
    RuneStrArray::const_iterator right;
    for (size_t i = 0; i < status.size(); i++) {
      if (status[i] % 2) { //if (HMMModel::E == status[i] || HMMModel::S == status[i])
        right = begin + i + 1;
        WordRange wr(left, right - 1);
        res.push_back(wr);
        left = right;
      }
    }
  }